

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  long ret;
  char local_19;
  long local_18;
  long local_10;
  
  local_10 = 0;
  local_19 = rhs.m_int;
  local_18 = lhs;
  DivisionHelper<long,_char,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_18,&local_19,&local_10);
  if ((char)local_10 != local_10) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)(char)local_10;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}